

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O0

nvpair_t * nvpair_create_stringv(char *name,char *valuefmt,__va_list_tag *valueap)

{
  int iVar1;
  char *pcStack_38;
  int len;
  char *str;
  nvpair_t *nvp;
  __va_list_tag *valueap_local;
  char *valuefmt_local;
  char *name_local;
  
  nvp = (nvpair_t *)valueap;
  valueap_local = (__va_list_tag *)valuefmt;
  valuefmt_local = name;
  iVar1 = vasprintf(&stack0xffffffffffffffc8,valuefmt,valueap);
  if (iVar1 < 0) {
    name_local = (char *)0x0;
  }
  else {
    str = (char *)nvpair_create_string(valuefmt_local,pcStack_38);
    free(pcStack_38);
    name_local = str;
  }
  return (nvpair_t *)name_local;
}

Assistant:

nvpair_t *
nvpair_create_stringv(const char *name, const char *valuefmt, va_list valueap)
{
	nvpair_t *nvp;
	char *str;
	int len;

	len = nv_vasprintf(&str, valuefmt, valueap);
	if (len < 0)
		return (NULL);
	nvp = nvpair_create_string(name, str);
	nv_free(str);
	return (nvp);
}